

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGSpatialSort.cpp
# Opt level: O1

void __thiscall
Assimp::SGSpatialSort::Add(SGSpatialSort *this,aiVector3D *vPosition,uint index,uint smoothingGroup)

{
  pointer *ppEVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  iterator __position;
  Entry local_18;
  
  local_18.mDistance =
       vPosition->z * (this->mPlaneNormal).z +
       vPosition->x * (this->mPlaneNormal).x + vPosition->y * (this->mPlaneNormal).y;
  uVar2 = vPosition->x;
  uVar3 = vPosition->y;
  local_18.mPosition.z = vPosition->z;
  __position._M_current =
       (this->mPositions).
       super__Vector_base<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->mPositions).
      super__Vector_base<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_18.mIndex = index;
    local_18.mPosition.x = (float)uVar2;
    local_18.mPosition.y = (float)uVar3;
    local_18.mSmoothGroups = smoothingGroup;
    std::vector<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>::
    _M_realloc_insert<Assimp::SGSpatialSort::Entry>(&this->mPositions,__position,&local_18);
  }
  else {
    (__position._M_current)->mSmoothGroups = smoothingGroup;
    (__position._M_current)->mDistance = local_18.mDistance;
    (__position._M_current)->mIndex = index;
    ((__position._M_current)->mPosition).x = (float)uVar2;
    ((__position._M_current)->mPosition).y = (float)uVar3;
    ((__position._M_current)->mPosition).z = local_18.mPosition.z;
    ppEVar1 = &(this->mPositions).
               super__Vector_base<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppEVar1 = *ppEVar1 + 1;
  }
  return;
}

Assistant:

void SGSpatialSort::Add(const aiVector3D& vPosition, unsigned int index,
    unsigned int smoothingGroup)
{
    // store position by index and distance
    float distance = vPosition * mPlaneNormal;
    mPositions.push_back( Entry( index, vPosition,
        distance, smoothingGroup));
}